

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::checktet4split(tetgenmesh *this,triface *chktet,int *qflag,double *ccent)

{
  double *pdVar1;
  int iVar2;
  tetrahedron *pppdVar3;
  tetrahedron ppdVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  TetSizeFunc p_Var7;
  tetgenbehavior *ptVar8;
  tetgenmesh *ptVar9;
  double dVar10;
  bool bVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  int *piVar15;
  tetgenbehavior *ptVar16;
  ulong uVar17;
  tetgenbehavior *this_00;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  tetgenbehavior *ptVar23;
  double vdc [3];
  double vdb [3];
  double vda [3];
  int indx [4];
  double N [4] [3];
  double vca [3];
  double vbc [3];
  double vab [3];
  double A [4] [4];
  double local_2a8 [4];
  double local_288 [4];
  double local_268 [4];
  int local_248;
  int local_244;
  int local_240;
  tetgenmesh *local_230;
  undefined1 local_228 [16];
  double local_218;
  tetgenbehavior *local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  triface *local_1e8;
  double dStack_1e0;
  double local_1d8 [12];
  double local_178 [4];
  double local_158 [4];
  double local_138 [4];
  double dStack_118;
  triface *local_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double local_f0;
  double local_e8 [4];
  double adStack_c8 [4];
  double adStack_a8 [8];
  double adStack_68 [7];
  
  local_208 = this->b;
  pppdVar3 = chktet->tet;
  if (((local_208->convex == 0) ||
      ((double)pppdVar3[(long)this->elemattribindex + (long)this->numelemattrib + -1] != -1.0)) ||
     (NAN((double)pppdVar3[(long)this->elemattribindex + (long)this->numelemattrib + -1]))) {
    *qflag = 0;
    ppdVar4 = pppdVar3[7];
    if (ppdVar4 != (tetrahedron)this->dummypoint) {
      ptVar16 = (tetgenbehavior *)pppdVar3[4];
      ppdVar5 = pppdVar3[5];
      ppdVar6 = pppdVar3[6];
      lVar12 = 0;
      do {
        dVar22 = *(double *)(&ptVar16->plc + lVar12 * 2) - (double)ppdVar4[lVar12];
        local_268[lVar12] = dVar22;
        local_e8[lVar12] = dVar22;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar12 = 0;
      do {
        pdVar13 = ppdVar5[lVar12];
        pdVar1 = ppdVar4[lVar12];
        local_288[lVar12] = (double)pdVar13 - (double)pdVar1;
        local_e8[lVar12 + 4] = (double)pdVar13 - (double)pdVar1;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar12 = 0;
      do {
        pdVar13 = ppdVar6[lVar12];
        pdVar1 = ppdVar4[lVar12];
        local_2a8[lVar12] = (double)pdVar13 - (double)pdVar1;
        adStack_a8[lVar12] = (double)pdVar13 - (double)pdVar1;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar12 = 0;
      do {
        local_138[lVar12] = (double)ppdVar5[lVar12] - *(double *)(&ptVar16->plc + lVar12 * 2);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar12 = 0;
      do {
        local_158[lVar12] = (double)ppdVar6[lVar12] - (double)ppdVar5[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar12 = 0;
      do {
        local_1d8[lVar12 + 0xc] = *(double *)(&ptVar16->plc + lVar12 * 2) - (double)ppdVar6[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      pdVar13 = local_138 + 3;
      local_230 = this;
      local_1f8 = qflag;
      local_1e8 = chktet;
      bVar11 = lu_decmp(this,&local_e8,3,&local_248,pdVar13,0);
      if (!bVar11) {
        return 0;
      }
      iVar2 = local_208->varvolume;
      if ((iVar2 != 0 || local_208->fixedvolume != 0) &&
         (((dVar22 = ABS(local_e8[(long)local_248 * 4] * local_e8[(long)local_244 * 4 + 1] *
                         local_e8[(long)local_240 * 4 + 2]) / 6.0,
           iVar2 == 0 || local_208->fixedvolume != 0 &&
           (local_208->maxvolume <= dVar22 && dVar22 != local_208->maxvolume)) ||
          ((iVar2 != 0 &&
           ((0.0 < (double)pppdVar3[local_230->volumeboundindex] &&
            ((double)pppdVar3[local_230->volumeboundindex] < dVar22)))))))) {
        *local_1f8 = 1;
        local_228._8_8_ =
             (local_288[2] * local_288[2] +
             local_288[0] * local_288[0] + local_288[1] * local_288[1]) * 0.5;
        local_228._0_8_ =
             (local_268[2] * local_268[2] +
             local_268[0] * local_268[0] + local_268[1] * local_268[1]) * 0.5;
        local_218 = (local_2a8[2] * local_2a8[2] +
                    local_2a8[0] * local_2a8[0] + local_2a8[1] * local_2a8[1]) * 0.5;
        lVar12 = 0;
        lu_solve((tetgenmesh *)local_208,&local_e8,3,&local_248,(double *)local_228,0);
        do {
          ccent[lVar12] = (double)ppdVar4[lVar12] + *(double *)(local_228 + lVar12 * 8);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        return 1;
      }
      this_00 = local_208;
      if (local_208->metric != 0) {
        pdVar13 = (double *)local_228;
        local_228._8_8_ =
             (local_288[2] * local_288[2] +
             local_288[0] * local_288[0] + local_288[1] * local_288[1]) * 0.5;
        local_228._0_8_ =
             (local_268[2] * local_268[2] +
             local_268[0] * local_268[0] + local_268[1] * local_268[1]) * 0.5;
        local_218 = (local_2a8[2] * local_2a8[2] +
                    local_2a8[0] * local_2a8[0] + local_2a8[1] * local_2a8[1]) * 0.5;
        lVar12 = 0;
        lu_solve((tetgenmesh *)local_208,&local_e8,3,&local_248,pdVar13,0);
        do {
          ccent[lVar12] = (double)ppdVar4[lVar12] + *(double *)(local_228 + lVar12 * 8);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        do {
          if ((0.0 < (double)pppdVar3[lVar12 + 4][local_230->pointmtrindex]) &&
             ((double)pppdVar3[lVar12 + 4][local_230->pointmtrindex] <
              SQRT(local_218 * local_218 +
                   (double)local_228._0_8_ * (double)local_228._0_8_ +
                   (double)local_228._8_8_ * (double)local_228._8_8_))) {
            *local_1f8 = 1;
            return 1;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
      }
      ptVar9 = local_230;
      p_Var7 = local_230->in->tetunsuitable;
      if (p_Var7 != (TetSizeFunc)0x0) {
        pdVar13 = (double *)0x0;
        bVar11 = (*p_Var7)((double *)ptVar16,(double *)ppdVar5,(double *)ppdVar6,(double *)ppdVar4,
                           (double *)0x0,0.0);
        this_00 = ptVar16;
        if (bVar11) {
          local_228._8_8_ =
               (local_288[2] * local_288[2] +
               local_288[0] * local_288[0] + local_288[1] * local_288[1]) * 0.5;
          local_228._0_8_ =
               (local_268[2] * local_268[2] +
               local_268[0] * local_268[0] + local_268[1] * local_268[1]) * 0.5;
          local_218 = (local_2a8[2] * local_2a8[2] +
                      local_2a8[0] * local_2a8[0] + local_2a8[1] * local_2a8[1]) * 0.5;
          lVar12 = 0;
          lu_solve((tetgenmesh *)ptVar16,&local_e8,3,&local_248,(double *)local_228,0);
          do {
            ccent[lVar12] = (double)ppdVar4[lVar12] + *(double *)(local_228 + lVar12 * 8);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          return 1;
        }
      }
      iVar2 = ptVar9->useinsertradius;
      if (iVar2 == 0) {
        ptVar16 = ptVar9->b;
        ptVar23 = (tetgenbehavior *)0x0;
      }
      else {
        pppdVar3 = local_1e8->tet;
        ptVar23 = (tetgenbehavior *)0x0;
        piVar15 = edge2ver;
        uVar17 = 0;
        do {
          ppdVar5 = pppdVar3[orgpivot[*piVar15]];
          ppdVar6 = pppdVar3[destpivot[*piVar15]];
          ptVar16 = (tetgenbehavior *)
                    SQRT(((double)ppdVar6[2] - (double)ppdVar5[2]) *
                         ((double)ppdVar6[2] - (double)ppdVar5[2]) +
                         ((double)*ppdVar6 - (double)*ppdVar5) *
                         ((double)*ppdVar6 - (double)*ppdVar5) +
                         ((double)ppdVar6[1] - (double)ppdVar5[1]) *
                         ((double)ppdVar6[1] - (double)ppdVar5[1]));
          (&dStack_118)[uVar17] = (double)ptVar16;
          if (uVar17 == 0) {
            pdVar13 = (double *)0x0;
            ptVar23 = ptVar16;
          }
          else if ((double)ptVar16 < (double)ptVar23) {
            pdVar13 = (double *)(uVar17 & 0xffffffff);
            ptVar23 = ptVar16;
          }
          uVar17 = uVar17 + 1;
          piVar15 = piVar15 + 1;
        } while (uVar17 != 6);
        this_00 = (tetgenbehavior *)(long)ptVar9->pointinsradiusindex;
        pdVar1 = pppdVar3[orgpivot[edge2ver[(int)pdVar13]]][(long)this_00];
        uVar20 = (undefined4)((ulong)pdVar1 >> 0x20);
        pdVar13 = pppdVar3[destpivot[edge2ver[(int)pdVar13]]][(long)this_00];
        uVar18 = (int)pdVar1;
        if ((0.0 < (double)pdVar13) &&
           (((double)pdVar1 <= 0.0 || ((double)pdVar13 < (double)pdVar1)))) {
          uVar18 = (int)pdVar13;
          uVar20 = (int)((ulong)pdVar13 >> 0x20);
        }
        ptVar16 = ptVar9->b;
        if ((0.0 <= (double)CONCAT44(uVar20,uVar18) && (double)CONCAT44(uVar20,uVar18) != 0.0) &&
           (uVar17 = -(ulong)(ABS((double)CONCAT44(uVar20,uVar18) - (double)ptVar23) /
                              (double)ptVar23 < ptVar16->epsilon),
           (double)ptVar23 < (double)(~uVar17 & CONCAT44(uVar20,uVar18) | uVar17 & (ulong)ptVar23)))
        {
          return 0;
        }
      }
      if (0.0 < ptVar16->minratio) {
        uStack_200 = 0;
        local_1f8 = (int *)(local_268[2] * local_268[2] +
                           local_268[0] * local_268[0] + local_268[1] * local_268[1]);
        local_1e8 = (triface *)
                    (local_288[2] * local_288[2] +
                    local_288[0] * local_288[0] + local_288[1] * local_288[1]);
        dStack_1e0 = local_2a8[2] * local_2a8[2] +
                     local_2a8[0] * local_2a8[0] + local_2a8[1] * local_2a8[1];
        uStack_1f0 = 0;
        local_228._8_4_ = SUB84((double)local_1e8 * 0.5,0);
        local_228._0_8_ = (double)local_1f8 * 0.5;
        local_228._12_4_ = (int)((ulong)((double)local_1e8 * 0.5) >> 0x20);
        local_218 = dStack_1e0 * 0.5;
        lVar12 = 0;
        local_208 = ptVar23;
        lu_solve((tetgenmesh *)this_00,&local_e8,3,&local_248,(double *)local_228,0);
        ptVar9 = local_230;
        do {
          ccent[lVar12] = (double)ppdVar4[lVar12] + *(double *)(local_228 + lVar12 * 8);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        ptVar8 = (tetgenbehavior *)
                 SQRT(local_218 * local_218 +
                      (double)local_228._0_8_ * (double)local_228._0_8_ +
                      (double)local_228._8_8_ * (double)local_228._8_8_);
        ptVar23 = local_208;
        if (iVar2 == 0) {
          local_110 = local_1e8;
          dStack_108 = dStack_1e0;
          local_100 = local_138[2] * local_138[2] +
                      local_138[0] * local_138[0] + local_138[1] * local_138[1];
          dStack_f8 = local_158[2] * local_158[2] +
                      local_158[0] * local_158[0] + local_158[1] * local_158[1];
          local_f0 = local_178[2] * local_178[2] +
                     local_178[0] * local_178[0] + local_178[1] * local_178[1];
          lVar12 = 1;
          uVar18 = (undefined4)local_1f8;
          uVar20 = local_1f8._4_4_;
          do {
            dVar22 = (&dStack_118)[lVar12];
            uVar19 = SUB84(dVar22,0);
            uVar21 = (int)((ulong)dVar22 >> 0x20);
            if ((double)CONCAT44(uVar20,uVar18) <= dVar22) {
              uVar19 = uVar18;
              uVar21 = uVar20;
            }
            lVar12 = lVar12 + 1;
            uVar18 = uVar19;
            uVar20 = uVar21;
          } while (lVar12 != 6);
          if ((double)CONCAT44(uVar21,uVar19) < 0.0) {
            local_208 = ptVar8;
            ptVar23 = (tetgenbehavior *)sqrt((double)CONCAT44(uVar21,uVar19));
            ptVar8 = local_208;
          }
          else {
            ptVar23 = (tetgenbehavior *)SQRT((double)CONCAT44(uVar21,uVar19));
          }
          ptVar16 = ptVar9->b;
        }
        if (ptVar16->minratio <= (double)ptVar8 / (double)ptVar23 &&
            (double)ptVar8 / (double)ptVar23 != ptVar16->minratio) {
          return 1;
        }
      }
      if (ptVar16->mindihedral <= 0.0) {
        return 0;
      }
      pdVar13 = local_1d8;
      lVar12 = 0;
      do {
        *pdVar13 = 0.0;
        pdVar13[1] = 0.0;
        pdVar13[2] = 0.0;
        *(undefined8 *)((long)local_1d8 + lVar12) = 0x3ff0000000000000;
        lu_solve((tetgenmesh *)this_00,&local_e8,3,&local_248,pdVar13,0);
        pdVar13 = pdVar13 + 3;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x60);
      lVar12 = 0;
      do {
        local_1d8[lVar12 + 9] = (-local_1d8[lVar12] - local_1d8[lVar12 + 3]) - local_1d8[lVar12 + 6]
        ;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      pdVar13 = local_1d8;
      lVar12 = 0;
      do {
        dVar22 = SQRT(local_1d8[lVar12 * 3 + 2] * local_1d8[lVar12 * 3 + 2] +
                      local_1d8[lVar12 * 3] * local_1d8[lVar12 * 3] +
                      local_1d8[lVar12 * 3 + 1] * local_1d8[lVar12 * 3 + 1]);
        if ((dVar22 == 0.0) && (!NAN(dVar22))) {
          puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
          puts("  the message above, your input data set, and the exact");
          puts("  command line you used to run this program, thank you.");
          exit(2);
        }
        lVar14 = 0;
        do {
          pdVar13[lVar14] = pdVar13[lVar14] / dVar22;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        lVar12 = lVar12 + 1;
        pdVar13 = pdVar13 + 3;
      } while (lVar12 != 4);
      dVar22 = -(local_1d8[2] * local_1d8[5] +
                local_1d8[0] * local_1d8[3] + local_1d8[1] * local_1d8[4]);
      adStack_68[1] =
           -(local_1d8[2] * local_1d8[8] + local_1d8[0] * local_1d8[6] + local_1d8[1] * local_1d8[7]
            );
      adStack_68[2] =
           -(local_1d8[2] * local_1d8[0xb] +
            local_1d8[0] * local_1d8[9] + local_1d8[1] * local_1d8[10]);
      adStack_68[3] =
           -(local_1d8[5] * local_1d8[8] + local_1d8[3] * local_1d8[6] + local_1d8[4] * local_1d8[7]
            );
      adStack_68[4] =
           -(local_1d8[5] * local_1d8[0xb] +
            local_1d8[3] * local_1d8[9] + local_1d8[4] * local_1d8[10]);
      adStack_68[5] =
           -(local_1d8[8] * local_1d8[0xb] +
            local_1d8[6] * local_1d8[9] + local_1d8[7] * local_1d8[10]);
      lVar12 = 1;
      do {
        dVar10 = adStack_68[lVar12];
        if (adStack_68[lVar12] <= dVar22) {
          dVar10 = dVar22;
        }
        dVar22 = dVar10;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 6);
      if (local_230->cosmindihed <= dVar22 && dVar22 != local_230->cosmindihed) {
        local_228._8_8_ =
             (local_288[2] * local_288[2] +
             local_288[0] * local_288[0] + local_288[1] * local_288[1]) * 0.5;
        local_228._0_8_ =
             (local_268[2] * local_268[2] +
             local_268[0] * local_268[0] + local_268[1] * local_268[1]) * 0.5;
        local_218 = (local_2a8[2] * local_2a8[2] +
                    local_2a8[0] * local_2a8[0] + local_2a8[1] * local_2a8[1]) * 0.5;
        lVar12 = 0;
        lu_solve((tetgenmesh *)this_00,&local_e8,3,&local_248,(double *)local_228,0);
        do {
          ccent[lVar12] = (double)ppdVar4[lVar12] + *(double *)(local_228 + lVar12 * 8);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::checktet4split(triface *chktet, int &qflag, REAL *ccent) 
{
  point pa, pb, pc, pd, *ppt;
  REAL vda[3], vdb[3], vdc[3];
  REAL vab[3], vbc[3], vca[3];
  REAL N[4][3], L[4], cosd[6], elen[6];
  REAL maxcosd, vol, volbnd, smlen = 0, rd;
  REAL A[4][4], rhs[4], D;
  int indx[4];
  int i, j;

  if (b->convex) { // -c
    // Skip this tet if it lies in the exterior.
    if (elemattribute(chktet->tet, numelemattrib - 1) == -1.0) {
      return 0;
    }
  }

  qflag = 0;

  pd = (point) chktet->tet[7];
  if (pd == dummypoint) {
    return 0; // Do not split a hull tet.
  }

  pa = (point) chktet->tet[4];
  pb = (point) chktet->tet[5];
  pc = (point) chktet->tet[6];

  // Get the edge vectors vda: d->a, vdb: d->b, vdc: d->c.
  // Set the matrix A = [vda, vdb, vdc]^T.
  for (i = 0; i < 3; i++) A[0][i] = vda[i] = pa[i] - pd[i];
  for (i = 0; i < 3; i++) A[1][i] = vdb[i] = pb[i] - pd[i];
  for (i = 0; i < 3; i++) A[2][i] = vdc[i] = pc[i] - pd[i];

  // Get the other edge vectors.
  for (i = 0; i < 3; i++) vab[i] = pb[i] - pa[i];
  for (i = 0; i < 3; i++) vbc[i] = pc[i] - pb[i];
  for (i = 0; i < 3; i++) vca[i] = pa[i] - pc[i];

  if (!lu_decmp(A, 3, indx, &D, 0)) {
    // A degenerated tet (vol = 0).
    // This is possible due to the use of exact arithmetic.  We temporarily
    //   leave this tet. It should be fixed by mesh optimization.
    return 0; 
  }

  // Check volume if '-a#' and '-a' options are used.
  if (b->varvolume || b->fixedvolume) {
    vol = fabs(A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2]) / 6.0;
    if (b->fixedvolume) {
      if (vol > b->maxvolume) {
        qflag = 1;
      }
    } 
    if (!qflag && b->varvolume) {
      volbnd = volumebound(chktet->tet);
      if ((volbnd > 0.0) && (vol > volbnd)) {
        qflag = 1;
      }
    }
    if (qflag == 1) {
      // Calculate the circumcenter of this tet.
      rhs[0] = 0.5 * dot(vda, vda);
      rhs[1] = 0.5 * dot(vdb, vdb);
      rhs[2] = 0.5 * dot(vdc, vdc);
      lu_solve(A, 3, indx, rhs, 0);            
      for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
      return 1;
    }
  }

  if (b->metric) { // -m option. Check mesh size. 
    // Calculate the circumradius of this tet.
    rhs[0] = 0.5 * dot(vda, vda);
    rhs[1] = 0.5 * dot(vdb, vdb);
    rhs[2] = 0.5 * dot(vdc, vdc);
    lu_solve(A, 3, indx, rhs, 0);            
    for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
    rd = sqrt(dot(rhs, rhs));
    // Check if the ccent lies outside one of the prot.balls at vertices.
    ppt = (point *) &(chktet->tet[4]);
    for (i = 0; i < 4; i++) {
      if (ppt[i][pointmtrindex] > 0) {
        if (rd > ppt[i][pointmtrindex]) {
          qflag = 1; // Enforce mesh size.
          return 1;
        }
      }
    }
  }

  if (in->tetunsuitable != NULL) {
    // Execute the user-defined meshing sizing evaluation.
    if ((*(in->tetunsuitable))(pa, pb, pc, pd, NULL, 0)) {
      // Calculate the circumcenter of this tet.
      rhs[0] = 0.5 * dot(vda, vda);
      rhs[1] = 0.5 * dot(vdb, vdb);
      rhs[2] = 0.5 * dot(vdc, vdc);
      lu_solve(A, 3, indx, rhs, 0);            
      for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
      return 1;
    }
  }

  if (useinsertradius) {
    // Do not split this tet if the shortest edge is shorter than the
    //   insertion radius of one of its endpoints.
    triface checkedge;
    point e1, e2;
    REAL rrv, smrrv;

    // Get the shortest edge of this tet.
    checkedge.tet = chktet->tet;
    for (i = 0; i < 6; i++) {
      checkedge.ver = edge2ver[i];
      e1 = org(checkedge);
      e2 = dest(checkedge);
      elen[i] = distance(e1, e2);
      if (i == 0) {
        smlen = elen[i];
        j = 0;
      } else {
        if (elen[i] < smlen) {
          smlen = elen[i];
          j = i;
        }
      }
    }
    // Check if the edge is too short.
    checkedge.ver = edge2ver[j];
    // Get the smallest rrv of e1 and e2.
    // Note: if rrv of e1 and e2 is zero. Do not use it.
    e1 = org(checkedge);
    smrrv = getpointinsradius(e1);
    e2 = dest(checkedge);
    rrv = getpointinsradius(e2);
    if (rrv > 0) {
      if (smrrv > 0) {
        if (rrv < smrrv) {
          smrrv = rrv;
        }
      } else {
        smrrv = rrv;
      }
    }
    if (smrrv > 0) {
      // To avoid rounding error, round smrrv before doing comparison.
      if ((fabs(smrrv - smlen) / smlen) < b->epsilon) {
        smrrv = smlen;
      }
      if (smrrv > smlen) {
        return 0;
      }
    }
  } // if (useinsertradius)

  // Check the radius-edge ratio. Set by -q#.
  if (b->minratio > 0) { 
    // Calculate the circumcenter and radius of this tet.
    rhs[0] = 0.5 * dot(vda, vda);
    rhs[1] = 0.5 * dot(vdb, vdb);
    rhs[2] = 0.5 * dot(vdc, vdc);
    lu_solve(A, 3, indx, rhs, 0);            
    for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
    rd = sqrt(dot(rhs, rhs));
    if (!useinsertradius) {
      // Calculate the shortest edge length.
      elen[0] = dot(vda, vda);
      elen[1] = dot(vdb, vdb);
      elen[2] = dot(vdc, vdc);
      elen[3] = dot(vab, vab);
      elen[4] = dot(vbc, vbc);
      elen[5] = dot(vca, vca);
      smlen = elen[0]; //sidx = 0;
      for (i = 1; i < 6; i++) {
        if (smlen > elen[i]) { 
          smlen = elen[i]; //sidx = i; 
        }
      }
      smlen = sqrt(smlen);
    }
    D = rd / smlen;
    if (D > b->minratio) {
      // A bad radius-edge ratio.
      return 1;
    }
  }

  // Check the minimum dihedral angle. Set by -qq#.
  if (b->mindihedral > 0) { 
    // Compute the 4 face normals (N[0], ..., N[3]).
    for (j = 0; j < 3; j++) {
      for (i = 0; i < 3; i++) N[j][i] = 0.0;
      N[j][j] = 1.0;  // Positive means the inside direction
      lu_solve(A, 3, indx, N[j], 0);
    }
    for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      L[i] = sqrt(dot(N[i], N[i]));
      if (L[i] == 0) {
        terminatetetgen(this, 2);
      }
      for (j = 0; j < 3; j++) N[i][j] /= L[i];
    }
    // Calculate the six dihedral angles.
    cosd[0] = -dot(N[0], N[1]); // Edge cd, bd, bc.
    cosd[1] = -dot(N[0], N[2]);
    cosd[2] = -dot(N[0], N[3]);
    cosd[3] = -dot(N[1], N[2]); // Edge ad, ac
    cosd[4] = -dot(N[1], N[3]);
    cosd[5] = -dot(N[2], N[3]); // Edge ab
    // Get the smallest dihedral angle.
    //maxcosd = mincosd = cosd[0];
    maxcosd = cosd[0];
    for (i = 1; i < 6; i++) {
      //if (cosd[i] > maxcosd) maxcosd = cosd[i];
      maxcosd = (cosd[i] > maxcosd ? cosd[i] : maxcosd);
      //mincosd = (cosd[i] < mincosd ? cosd[i] : maxcosd);
    }
    if (maxcosd > cosmindihed) {
      // Calculate the circumcenter of this tet.
      // A bad dihedral angle.
      //if ((b->quality & 1) == 0) {
        rhs[0] = 0.5 * dot(vda, vda);
        rhs[1] = 0.5 * dot(vdb, vdb);
        rhs[2] = 0.5 * dot(vdc, vdc);
        lu_solve(A, 3, indx, rhs, 0);            
        for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
        //*rd = sqrt(dot(rhs, rhs));
      //}
      return 1;
    }
  }

  return 0;
}